

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O2

void la_dgeadd_os(int m,int n,double *a,int lda,double *b,int ldb,double *c,int ldc)

{
  uint __line;
  int j;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  char *__assertion;
  ulong uVar4;
  
  if (a == (double *)0x0) {
    __assertion = "a";
    __line = 0x27;
  }
  else if (b == (double *)0x0) {
    __assertion = "b";
    __line = 0x28;
  }
  else if (c == (double *)0x0) {
    __assertion = "c";
    __line = 0x29;
  }
  else if ((lda < 1) || (lda < n)) {
    __assertion = "lda >= 1 && lda >= n";
    __line = 0x2a;
  }
  else if ((ldb < 1) || (ldb < n)) {
    __assertion = "ldb >= 1 && ldb >= n";
    __line = 0x2b;
  }
  else {
    if ((0 < ldc) && (n <= ldc)) {
      uVar4 = 0;
      uVar2 = (ulong)(uint)n;
      if (n < 1) {
        uVar2 = uVar4;
      }
      uVar3 = (ulong)(uint)m;
      if (m < 1) {
        uVar3 = uVar4;
      }
      for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
        for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
          c[uVar1] = a[uVar1] + b[uVar1];
        }
        c = c + (uint)ldc;
        b = b + (uint)ldb;
        a = a + (uint)lda;
      }
      return;
    }
    __assertion = "ldc >= 1 && ldc >= n";
    __line = 0x2c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,__line,
                "void la_dgeadd_os(int, int, const double *, int, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgeadd_os(
        int m, int n,
        const double *a, int lda,
        const double *b, int ldb,
        double *c, int ldc)
{
    assert(a);
    assert(b);
    assert(c);
    assert(lda >= 1 && lda >= n);
    assert(ldb >= 1 && ldb >= n);
    assert(ldc >= 1 && ldc >= n);

    for (int i = 0; i < m; i++) {
        for (int j = 0; j < n; j++) {
            c[i * ldc + j] = a[i * lda + j] + b[i * ldb + j];
        }
    }
}